

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

bool __thiscall duckdb::IEJoinUnion::NextRow(IEJoinUnion *this)

{
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_00;
  ulong uVar1;
  size_type __n;
  long lVar2;
  ulong __n_00;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pSVar6;
  type pSVar7;
  idx_t __n_01;
  
  __n_01 = this->i;
  while (uVar1 = this->n, __n_01 < uVar1) {
    pvVar4 = vector<unsigned_long,_true>::get<true>(&this->p,__n_01);
    __n = *pvVar4;
    pvVar5 = vector<long,_true>::get<true>(&this->li,__n);
    lVar2 = *pvVar5;
    this->lrid = lVar2;
    if (-1 < lVar2) {
      pSVar6 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
               operator->(&this->op2);
      SBIterator::SetIndex(pSVar6,this->i);
      this_00 = &this->off2;
      goto LAB_009ba508;
    }
    __n_01 = this->i + 1;
    this->i = __n_01;
  }
LAB_009ba5b0:
  return __n_01 < uVar1;
LAB_009ba508:
  pSVar6 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                     (this_00);
  if (this->n <= pSVar6->entry_idx) goto LAB_009ba5a9;
  pSVar6 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                     (this_00);
  pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                     (&this->op2);
  bVar3 = SBIterator::Compare(pSVar6,pSVar7);
  if (!bVar3) goto LAB_009ba5a9;
  pSVar6 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                     (this_00);
  pvVar4 = vector<unsigned_long,_true>::get<true>(&this->p,pSVar6->entry_idx);
  __n_00 = *pvVar4;
  pvVar5 = vector<long,_true>::get<true>(&this->li,__n_00);
  if (*pvVar5 < 0) {
    TemplatedValidityMask<unsigned_long>::SetValid
              (&(this->bit_mask).super_TemplatedValidityMask<unsigned_long>,__n_00);
    TemplatedValidityMask<unsigned_long>::SetValid
              (&(this->bloom_filter).super_TemplatedValidityMask<unsigned_long>,__n_00 >> 10);
  }
  pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                     (this_00);
  SBIterator::operator++(pSVar7);
  goto LAB_009ba508;
LAB_009ba5a9:
  this->j = __n;
  goto LAB_009ba5b0;
}

Assistant:

bool IEJoinUnion::NextRow() {
	for (; i < n; ++i) {
		// 12. pos ← P[i]
		auto pos = p[i];
		lrid = li[pos];
		if (lrid < 0) {
			continue;
		}

		// 16. B[pos] ← 1
		op2->SetIndex(i);
		for (; off2->GetIndex() < n; ++(*off2)) {
			if (!off2->Compare(*op2)) {
				break;
			}
			const auto p2 = p[off2->GetIndex()];
			if (li[p2] < 0) {
				// Only mark rhs matches.
				bit_mask.SetValid(p2);
				bloom_filter.SetValid(p2 / BLOOM_CHUNK_BITS);
			}
		}

		// 9.  if (op1 ∈ {≤,≥} and op2 ∈ {≤,≥}) eqOff = 0
		// 10. else eqOff = 1
		// No, because there could be more than one equal value.
		// Find the leftmost off1 where L1[pos] op1 L1[off1..n]
		// These are the rows that satisfy the op1 condition
		// and that is where we should start scanning B from
		j = pos;

		return true;
	}
	return false;
}